

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrMan.c
# Opt level: O0

Vec_Int_t * Pdr_ManDeriveFlopPriorities3(Gia_Man_t *p,int fMuxCtrls)

{
  int *piVar1;
  Vec_Bit_t *pVVar2;
  Gia_Man_t *pGVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  Gia_Obj_t *pGVar8;
  char *pcVar9;
  bool bVar10;
  uint local_a4;
  uint local_a0;
  int nBoth;
  int nDatas;
  int nCtrls;
  Gia_Obj_t *pData0_1;
  Gia_Obj_t *pData1_1;
  Gia_Obj_t *pCtrl_1;
  Vec_Bit_t *vDatas;
  Vec_Bit_t *vCtrls;
  int local_68;
  int fVerbose;
  int MaxEntry;
  int Entry;
  int k;
  int i;
  Gia_Obj_t *pData1;
  Gia_Obj_t *pData0;
  Gia_Obj_t *pCtrl;
  Gia_Obj_t *pObj;
  Vec_Int_t *vCosts;
  Vec_Int_t *vLevel;
  Vec_Int_t *vRes;
  Vec_Wec_t *vLevels;
  int fDiscount;
  int fMuxCtrls_local;
  Gia_Man_t *p_local;
  
  vLevels._0_4_ = 0;
  local_68 = 0;
  vLevels._4_4_ = fMuxCtrls;
  _fDiscount = p;
  Gia_ManCreateRefs(p);
  if ((int)vLevels != 0) {
    Entry = 0;
    while( true ) {
      bVar10 = false;
      if (Entry < _fDiscount->nObjs) {
        pCtrl = Gia_ManObj(_fDiscount,Entry);
        bVar10 = pCtrl != (Gia_Obj_t *)0x0;
      }
      if (!bVar10) break;
      iVar4 = Gia_ObjIsAnd(pCtrl);
      if ((iVar4 != 0) && (iVar4 = Gia_ObjIsMuxType(pCtrl), iVar4 != 0)) {
        pGVar8 = Gia_ObjRecognizeMux(pCtrl,(Gia_Obj_t **)&k,&pData1);
        pData0 = Gia_Regular(pGVar8);
        pData1 = Gia_Regular(pData1);
        _k = Gia_Regular(_k);
        piVar1 = _fDiscount->pRefs;
        iVar4 = Gia_ObjId(_fDiscount,pData0);
        piVar1[iVar4] = piVar1[iVar4] + -1;
        if (pData1 == _k) {
          piVar1 = _fDiscount->pRefs;
          iVar4 = Gia_ObjId(_fDiscount,pData1);
          piVar1[iVar4] = piVar1[iVar4] + -1;
        }
      }
      Entry = Entry + 1;
    }
  }
  iVar4 = Gia_ManRegNum(_fDiscount);
  pObj = (Gia_Obj_t *)Vec_IntAlloc(iVar4);
  Entry = 0;
  while( true ) {
    iVar4 = Entry;
    iVar5 = Gia_ManRegNum(_fDiscount);
    pGVar3 = _fDiscount;
    bVar10 = false;
    if (iVar4 < iVar5) {
      iVar4 = Gia_ManPiNum(_fDiscount);
      pCtrl = Gia_ManCi(pGVar3,iVar4 + Entry);
      bVar10 = pCtrl != (Gia_Obj_t *)0x0;
    }
    pGVar8 = pObj;
    if (!bVar10) break;
    iVar4 = Gia_ObjRefNum(_fDiscount,pCtrl);
    Vec_IntPush((Vec_Int_t *)pGVar8,iVar4);
    iVar4 = local_68;
    iVar5 = Gia_ObjRefNum(_fDiscount,pCtrl);
    local_68 = Abc_MaxInt(iVar4,iVar5);
    Entry = Entry + 1;
  }
  local_68 = local_68 + 1;
  if (vLevels._4_4_ != 0) {
    vCtrls._4_4_ = 0;
    iVar4 = Gia_ManObjNum(_fDiscount);
    vDatas = Vec_BitStart(iVar4);
    iVar4 = Gia_ManObjNum(_fDiscount);
    pCtrl_1 = (Gia_Obj_t *)Vec_BitStart(iVar4);
    nBoth = 0;
    local_a0 = 0;
    local_a4 = 0;
    Entry = 0;
    while( true ) {
      bVar10 = false;
      if (Entry < _fDiscount->nObjs) {
        pCtrl = Gia_ManObj(_fDiscount,Entry);
        bVar10 = pCtrl != (Gia_Obj_t *)0x0;
      }
      if (!bVar10) break;
      iVar4 = Gia_ObjIsAnd(pCtrl);
      if ((iVar4 != 0) && (iVar4 = Gia_ObjIsMuxType(pCtrl), iVar4 != 0)) {
        pData1_1 = Gia_ObjRecognizeMux(pCtrl,&pData0_1,(Gia_Obj_t **)&nDatas);
        pData1_1 = Gia_Regular(pData1_1);
        pData0_1 = Gia_Regular(pData0_1);
        _nDatas = Gia_Regular(_nDatas);
        pVVar2 = vDatas;
        iVar4 = Gia_ObjId(_fDiscount,pData1_1);
        Vec_BitWriteEntry(pVVar2,iVar4,1);
        pGVar8 = pCtrl_1;
        iVar4 = Gia_ObjId(_fDiscount,pData0_1);
        Vec_BitWriteEntry((Vec_Bit_t *)pGVar8,iVar4,1);
        pGVar8 = pCtrl_1;
        iVar4 = Gia_ObjId(_fDiscount,_nDatas);
        Vec_BitWriteEntry((Vec_Bit_t *)pGVar8,iVar4,1);
      }
      Entry = Entry + 1;
    }
    Entry = 0;
    while( true ) {
      iVar4 = Entry;
      iVar5 = Gia_ManRegNum(_fDiscount);
      pGVar3 = _fDiscount;
      bVar10 = false;
      if (iVar4 < iVar5) {
        iVar4 = Gia_ManPiNum(_fDiscount);
        pCtrl = Gia_ManCi(pGVar3,iVar4 + Entry);
        bVar10 = pCtrl != (Gia_Obj_t *)0x0;
      }
      pVVar2 = vDatas;
      if (!bVar10) break;
      iVar4 = Gia_ObjId(_fDiscount,pCtrl);
      iVar4 = Vec_BitEntry(pVVar2,iVar4);
      if (iVar4 != 0) {
        Vec_IntAddToEntry((Vec_Int_t *)pObj,Entry,local_68);
      }
      Entry = Entry + 1;
    }
    local_68 = local_68 * 2 + 1;
    if (vCtrls._4_4_ != 0) {
      Entry = 0;
      while( true ) {
        iVar4 = Entry;
        iVar5 = Gia_ManRegNum(_fDiscount);
        pGVar3 = _fDiscount;
        bVar10 = false;
        if (iVar4 < iVar5) {
          iVar4 = Gia_ManPiNum(_fDiscount);
          pCtrl = Gia_ManCi(pGVar3,iVar4 + Entry);
          bVar10 = pCtrl != (Gia_Obj_t *)0x0;
        }
        pVVar2 = vDatas;
        if (!bVar10) break;
        iVar4 = Gia_ObjId(_fDiscount,pCtrl);
        iVar4 = Vec_BitEntry(pVVar2,iVar4);
        pGVar8 = pCtrl_1;
        if (iVar4 != 0) {
          nBoth = nBoth + 1;
        }
        iVar4 = Gia_ObjId(_fDiscount,pCtrl);
        iVar4 = Vec_BitEntry((Vec_Bit_t *)pGVar8,iVar4);
        pVVar2 = vDatas;
        if (iVar4 != 0) {
          local_a0 = local_a0 + 1;
        }
        iVar4 = Gia_ObjId(_fDiscount,pCtrl);
        iVar4 = Vec_BitEntry(pVVar2,iVar4);
        pGVar8 = pCtrl_1;
        if (iVar4 != 0) {
          iVar4 = Gia_ObjId(_fDiscount,pCtrl);
          iVar4 = Vec_BitEntry((Vec_Bit_t *)pGVar8,iVar4);
          if (iVar4 != 0) {
            local_a4 = local_a4 + 1;
          }
        }
        Entry = Entry + 1;
      }
      pcVar9 = Gia_ManName(_fDiscount);
      uVar6 = Gia_ManRegNum(_fDiscount);
      printf("%10s : Flops = %5d.  Ctrls = %5d.  Datas = %5d.  Both = %5d.\n",pcVar9,(ulong)uVar6,
             (ulong)(uint)nBoth,(ulong)local_a0,(ulong)local_a4);
    }
    Vec_BitFree(vDatas);
    Vec_BitFree((Vec_Bit_t *)pCtrl_1);
  }
  vRes = (Vec_Int_t *)Vec_WecStart(local_68);
  for (Entry = 0; iVar4 = Entry, iVar5 = Vec_IntSize((Vec_Int_t *)pObj), iVar4 < iVar5;
      Entry = Entry + 1) {
    fVerbose = Vec_IntEntry((Vec_Int_t *)pObj,Entry);
    Vec_WecPush((Vec_Wec_t *)vRes,fVerbose,Entry);
  }
  local_68 = 0;
  iVar4 = Gia_ManRegNum(_fDiscount);
  vLevel = Vec_IntStart(iVar4);
  for (Entry = 0; iVar5 = Entry, iVar7 = Vec_WecSize((Vec_Wec_t *)vRes), iVar4 = local_68,
      iVar5 < iVar7; Entry = Entry + 1) {
    vCosts = Vec_WecEntry((Vec_Wec_t *)vRes,Entry);
    for (MaxEntry = 0; iVar4 = MaxEntry, iVar5 = Vec_IntSize(vCosts), iVar4 < iVar5;
        MaxEntry = MaxEntry + 1) {
      fVerbose = Vec_IntEntry(vCosts,MaxEntry);
      iVar4 = local_68;
      local_68 = local_68 + 1;
      Vec_IntWriteEntry(vLevel,fVerbose,iVar4);
    }
  }
  iVar5 = Gia_ManRegNum(_fDiscount);
  if (iVar4 == iVar5) {
    Vec_WecFree((Vec_Wec_t *)vRes);
    Vec_IntFree((Vec_Int_t *)pObj);
    if (_fDiscount->pRefs != (int *)0x0) {
      free(_fDiscount->pRefs);
      _fDiscount->pRefs = (int *)0x0;
    }
    return vLevel;
  }
  __assert_fail("MaxEntry == Gia_ManRegNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrMan.c"
                ,0x86,"Vec_Int_t *Pdr_ManDeriveFlopPriorities3(Gia_Man_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Structural analysis.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Pdr_ManDeriveFlopPriorities3( Gia_Man_t * p, int fMuxCtrls )
{
    int fDiscount = 0;
    Vec_Wec_t * vLevels;
    Vec_Int_t * vRes, * vLevel, * vCosts;
    Gia_Obj_t * pObj, * pCtrl, * pData0, * pData1; 
    int i, k, Entry, MaxEntry = 0;
    Gia_ManCreateRefs(p);
    // discount references
    if ( fDiscount )
    {
        Gia_ManForEachAnd( p, pObj, i )
        {
            if ( !Gia_ObjIsMuxType(pObj) )
                continue;
            pCtrl  = Gia_Regular(Gia_ObjRecognizeMux(pObj, &pData1, &pData0));
            pData0 = Gia_Regular(pData0);
            pData1 = Gia_Regular(pData1);
            p->pRefs[Gia_ObjId(p, pCtrl)]--;
            if ( pData0 == pData1 )
                p->pRefs[Gia_ObjId(p, pData0)]--;
        }
    }
    // create flop costs
    vCosts = Vec_IntAlloc( Gia_ManRegNum(p) );
    Gia_ManForEachRo( p, pObj, i )
    {
        Vec_IntPush( vCosts, Gia_ObjRefNum(p, pObj) );
        MaxEntry = Abc_MaxInt( MaxEntry, Gia_ObjRefNum(p, pObj) );
        //printf( "%d(%d) ", i, Gia_ObjRefNum(p, pObj) );
    }
    //printf( "\n" );
    MaxEntry++;
    // add costs due to MUX inputs
    if ( fMuxCtrls )
    {
        int fVerbose = 0;
        Vec_Bit_t * vCtrls = Vec_BitStart( Gia_ManObjNum(p) );
        Vec_Bit_t * vDatas = Vec_BitStart( Gia_ManObjNum(p) );
        Gia_Obj_t * pCtrl, * pData1, * pData0; 
        int nCtrls = 0, nDatas = 0, nBoth = 0;
        Gia_ManForEachAnd( p, pObj, i )
        {
            if ( !Gia_ObjIsMuxType(pObj) )
                continue;
            pCtrl  = Gia_ObjRecognizeMux( pObj, &pData1, &pData0 );
            pCtrl  = Gia_Regular(pCtrl);
            pData1 = Gia_Regular(pData1);
            pData0 = Gia_Regular(pData0);
            Vec_BitWriteEntry( vCtrls, Gia_ObjId(p, pCtrl), 1 );
            Vec_BitWriteEntry( vDatas, Gia_ObjId(p, pData1), 1 );
            Vec_BitWriteEntry( vDatas, Gia_ObjId(p, pData0), 1 );
        }
        Gia_ManForEachRo( p, pObj, i )
            if ( Vec_BitEntry(vCtrls, Gia_ObjId(p, pObj)) )
                Vec_IntAddToEntry( vCosts, i, MaxEntry );
            //else if ( Vec_BitEntry(vDatas, Gia_ObjId(p, pObj)) )
            //    Vec_IntAddToEntry( vCosts, i,   MaxEntry );
        MaxEntry = 2*MaxEntry + 1;
        // print out
        if ( fVerbose )
        {
            Gia_ManForEachRo( p, pObj, i )
            {
                if ( Vec_BitEntry(vCtrls, Gia_ObjId(p, pObj)) )
                    nCtrls++;
                if ( Vec_BitEntry(vDatas, Gia_ObjId(p, pObj)) )
                    nDatas++;
                if ( Vec_BitEntry(vCtrls, Gia_ObjId(p, pObj)) && Vec_BitEntry(vDatas, Gia_ObjId(p, pObj)) )
                    nBoth++;
            }
            printf( "%10s : Flops = %5d.  Ctrls = %5d.  Datas = %5d.  Both = %5d.\n", Gia_ManName(p), Gia_ManRegNum(p), nCtrls, nDatas, nBoth );
        }
        Vec_BitFree( vCtrls );
        Vec_BitFree( vDatas );
    }
    // create levelized structure
    vLevels = Vec_WecStart( MaxEntry );
    Vec_IntForEachEntry( vCosts, Entry, i )
        Vec_WecPush( vLevels, Entry, i );
    // collect in this order
    MaxEntry = 0;
    vRes = Vec_IntStart( Gia_ManRegNum(p) );
    Vec_WecForEachLevel( vLevels, vLevel, i )
        Vec_IntForEachEntry( vLevel, Entry, k )
            Vec_IntWriteEntry( vRes, Entry, MaxEntry++ );
        //printf( "%d ", Gia_ObjRefNum(p, Gia_ManCi(p, Gia_ManPiNum(p)+Entry)) );
    //printf( "\n" );
    assert( MaxEntry == Gia_ManRegNum(p) );
    Vec_WecFree( vLevels );
    Vec_IntFree( vCosts );
    ABC_FREE( p->pRefs );
//Vec_IntPrint( vRes );
    return vRes;
}